

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O0

GLboolean glewGetExtension(char *name)

{
  GLuint GVar1;
  GLubyte *s;
  GLubyte *end;
  GLubyte *start;
  char *name_local;
  
  s = (GLubyte *)glGetString(0x1f03);
  if (s == (GLubyte *)0x0) {
    name_local._7_1_ = '\0';
  }
  else {
    GVar1 = _glewStrLen(s);
    name_local._7_1_ = _glewSearchExtension(name,s,s + GVar1);
  }
  return name_local._7_1_;
}

Assistant:

GLboolean GLEWAPIENTRY glewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;
  start = (const GLubyte*)glGetString(GL_EXTENSIONS);
  if (start == 0)
    return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}